

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall
wirehair::Codec::InitializeDecoder(Codec *this,uint64_t message_bytes,uint32_t block_bytes)

{
  bool bVar1;
  WirehairResult WVar2;
  uint uVar3;
  ulong in_RSI;
  uint *in_RDI;
  uint partial_final_bytes;
  WirehairResult result;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  WVar2 = ChooseMatrix((Codec *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (uint64_t)in_RDI,in_stack_ffffffffffffffcc);
  if (WVar2 == Wirehair_Success) {
    uVar3 = (uint)(in_RSI % (ulong)*in_RDI);
    if (uVar3 == 0) {
      uVar3 = *in_RDI;
    }
    *(undefined2 *)((long)in_RDI + 0x16) = 0;
    in_RDI[0xf] = uVar3;
    in_RDI[0xe] = *in_RDI;
    *(undefined2 *)(in_RDI + 5) = 0x20;
    *(undefined1 *)(in_RDI + 0x12) = 1;
    *(undefined1 *)(in_RDI + 0x16) = 1;
    bVar1 = AllocateInput((Codec *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
    if (bVar1) {
      bVar1 = AllocateWorkspace((Codec *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8));
      if (!bVar1) {
        WVar2 = Wirehair_OOM;
      }
    }
    else {
      WVar2 = Wirehair_OOM;
    }
  }
  return WVar2;
}

Assistant:

WirehairResult Codec::InitializeDecoder(
    uint64_t message_bytes,
    uint32_t block_bytes)
{
    const WirehairResult result = ChooseMatrix(message_bytes, block_bytes);

    if (result != Wirehair_Success) {
        return result;
    }

    // Calculate partial final bytes
    unsigned partial_final_bytes = message_bytes % _block_bytes;
    if (partial_final_bytes <= 0) {
        partial_final_bytes = _block_bytes;
    }

    // Decoder-specific
    _row_count = 0;
    _output_final_bytes = partial_final_bytes;

    // Hack: Prevents row-based ids from causing partial copies when they
    // happen to be the last block id.  This is only an issue because the
    // shared codec source code happens to be built with more encoder-like
    // semantics
    _input_final_bytes = _block_bytes;

    _extra_count = CAT_MAX_EXTRA_ROWS;
#if defined(CAT_ALL_ORIGINAL)
    _all_original = true;
#endif
    _original_out_of_order = true;

    if (!AllocateInput()) {
        CAT_DEBUG_BREAK();
        return Wirehair_OOM;
    }

    if (!AllocateWorkspace()) {
        CAT_DEBUG_BREAK();
        return Wirehair_OOM;
    }

    return result;
}